

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogButtons(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int *v;
  ImVec2 local_30;
  
  v = &GImGui->LogDepthToExpandDefault;
  PushID("LogButtons");
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar2 = Button("Log To TTY",&local_30);
  SameLine(0.0,-1.0);
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar3 = Button("Log To File",&local_30);
  SameLine(0.0,-1.0);
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar4 = Button("Log To Clipboard",&local_30);
  SameLine(0.0,-1.0);
  PushAllowKeyboardFocus(false);
  pIVar1 = GImGui;
  (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
  (pIVar1->NextItemData).Width = 80.0;
  SliderInt("Default Depth",v,0,9,(char *)0x0,0);
  PopItemFlag();
  PopID();
  if (bVar2) {
    LogToTTY(-1);
  }
  if (bVar3) {
    LogToFile(-1,(char *)0x0);
  }
  if (bVar4) {
    LogToClipboard(-1);
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
    const bool log_to_tty = Button("Log To TTY"); SameLine();
#else
    const bool log_to_tty = false;
#endif
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushAllowKeyboardFocus(false);
    SetNextItemWidth(80.0f);
    SliderInt("Default Depth", &g.LogDepthToExpandDefault, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY();
    if (log_to_file)
        LogToFile();
    if (log_to_clipboard)
        LogToClipboard();
}